

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_key_share.cc
# Opt level: O2

bool __thiscall
bssl::anon_unknown_0::X25519MLKEM768KeyShare::Decap
          (X25519MLKEM768KeyShare *this,Array<unsigned_char> *out_secret,uint8_t *out_alert,
          Span<const_unsigned_char> ciphertext)

{
  bool bVar1;
  int iVar2;
  Array<unsigned_char> secret;
  
  *out_alert = 'P';
  secret.data_ = (uchar *)0x0;
  secret.size_ = 0;
  bVar1 = Array<unsigned_char>::InitUninitialized(&secret,0x40);
  if (bVar1) {
    if (ciphertext.size_ == 0x460) {
      iVar2 = MLKEM768_decap(secret.data_,ciphertext.data_,0x440,&this->mlkem_private_key_);
      if (iVar2 != 0) {
        iVar2 = X25519(secret.data_ + 0x20,this->x25519_private_key_,ciphertext.data_ + 0x440);
        if (iVar2 != 0) {
          bVar1 = true;
          Array<unsigned_char>::operator=(out_secret,&secret);
          goto LAB_0014f23a;
        }
      }
    }
    *out_alert = '/';
    bVar1 = false;
    ERR_put_error(0x10,0,0x6c,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_key_share.cc"
                  ,0x16d);
  }
  else {
    bVar1 = false;
  }
LAB_0014f23a:
  Array<unsigned_char>::~Array(&secret);
  return bVar1;
}

Assistant:

bool Decap(Array<uint8_t> *out_secret, uint8_t *out_alert,
             Span<const uint8_t> ciphertext) override {
    *out_alert = SSL_AD_INTERNAL_ERROR;

    Array<uint8_t> secret;
    if (!secret.InitForOverwrite(MLKEM_SHARED_SECRET_BYTES +
                                 X25519_SHARED_KEY_LEN)) {
      return false;
    }

    if (ciphertext.size() !=
            MLKEM768_CIPHERTEXT_BYTES + X25519_PUBLIC_VALUE_LEN ||
        !MLKEM768_decap(secret.data(), ciphertext.data(),
                        MLKEM768_CIPHERTEXT_BYTES, &mlkem_private_key_) ||
        !X25519(secret.data() + MLKEM_SHARED_SECRET_BYTES, x25519_private_key_,
                ciphertext.data() + MLKEM768_CIPHERTEXT_BYTES)) {
      *out_alert = SSL_AD_ILLEGAL_PARAMETER;
      OPENSSL_PUT_ERROR(SSL, SSL_R_BAD_ECPOINT);
      return false;
    }

    *out_secret = std::move(secret);
    return true;
  }